

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

int bmp_read_8bit(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int local_44;
  int local_40;
  int padding;
  int index;
  int row;
  int xpos;
  int ypos;
  bmp_hdr_t *header_local;
  bmp_info_t *info_local;
  gdIOCtxPtr infile_local;
  gdImagePtr im_local;
  
  row = 0;
  index = 0;
  padding = 0;
  local_40 = 0;
  if ((info->enctype == 0) || (info->enctype == 1)) {
    if (info->numcolors == 0) {
      info->numcolors = 0x100;
    }
    else if ((info->numcolors < 0) || (0x100 < info->numcolors)) {
      return 1;
    }
    _xpos = header;
    header_local = (bmp_hdr_t *)info;
    info_local = (bmp_info_t *)infile;
    infile_local = (gdIOCtxPtr)im;
    iVar2 = bmp_read_palette(im,infile,info->numcolors,(uint)(info->type == 2));
    if (iVar2 == 0) {
      *(undefined4 *)&infile_local->putC = *(undefined4 *)&header_local[2].reserved1;
      lVar3 = gdTell((gdIOCtx *)info_local);
      if ((lVar3 == _xpos->off) || (iVar2 = gdSeek((gdIOCtx *)info_local,_xpos->off), iVar2 != 0)) {
        local_44 = *(int *)&header_local->reserved1 % 4;
        if (local_44 != 0) {
          local_44 = 4 - local_44;
        }
        iVar2._0_2_ = header_local[1].reserved1;
        iVar2._2_2_ = header_local[1].reserved2;
        if (iVar2 == 0) {
          for (row = 0; row < header_local->off; row = row + 1) {
            if ((char)header_local[1].magic == '\0') {
              padding = (header_local->off - row) + -1;
            }
            else {
              padding = row;
            }
            for (index = 0; iVar1._0_2_ = header_local->reserved1,
                iVar1._2_2_ = header_local->reserved2, index < iVar1; index = index + 1) {
              iVar2 = gdGetByte(&local_40,(gdIOCtx *)info_local);
              if (iVar2 == 0) {
                return 1;
              }
              if (*(int *)((long)&infile_local[0x30].putC + (long)local_40 * 4 + 4) != 0) {
                *(undefined4 *)((long)&infile_local[0x30].putC + (long)local_40 * 4 + 4) = 0;
              }
              gdImageSetPixel((gdImagePtr)infile_local,index,padding,local_40);
            }
            for (index = local_44; 0 < index; index = index + -1) {
              iVar2 = gdGetByte(&local_40,(gdIOCtx *)info_local);
              if (iVar2 == 0) {
                return 1;
              }
            }
          }
        }
        else {
          if (iVar2 != 1) {
            return 1;
          }
          iVar2 = bmp_read_rle((gdImagePtr)infile_local,(gdIOCtxPtr)info_local,
                               (bmp_info_t *)header_local);
          if (iVar2 != 0) {
            return 1;
          }
        }
        im_local._4_4_ = 0;
      }
      else {
        im_local._4_4_ = 1;
      }
    }
    else {
      im_local._4_4_ = 1;
    }
  }
  else {
    im_local._4_4_ = 1;
  }
  return im_local._4_4_;
}

Assistant:

static int bmp_read_8bit(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0, index = 0;
	int padding = 0;

	if (info->enctype != BMP_BI_RGB && info->enctype != BMP_BI_RLE8) {
		return 1;
	}

	if (!info->numcolors) {
		info->numcolors = 256;
	} else if (info->numcolors < 0 || info->numcolors > 256) {
		return 1;
	}

	if (bmp_read_palette(im, infile, info->numcolors, (info->type == BMP_PALETTE_4))) {
		return 1;
	}

	im->colorsTotal = info->numcolors;

	/* There is a chance the data isn't until later, would be weird but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		if (!gdSeek(infile, header->off)) {
			return 1;
		}
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = (1 * info->width) % 4;
	if (padding) {
		padding = 4 - padding;
	}

	switch (info->enctype) {
	case BMP_BI_RGB:
		for (ypos = 0; ypos < info->height; ++ypos) {
			if (info->topdown) {
				row = ypos;
			} else {
				row = info->height - ypos - 1;
			}

			for (xpos = 0; xpos < info->width; ++xpos) {
				if (!gdGetByte(&index, infile)) {
					return 1;
				}

				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos, row, index);
			}
			/* Could create a new variable, but it isn't really worth it */
			for (xpos = padding; xpos > 0; --xpos) {
				if (!gdGetByte(&index, infile)) {
					return 1;
				}
			}
		}
		break;

	case BMP_BI_RLE8:
		if (bmp_read_rle(im, infile, info)) {
			return 1;
		}
		break;

	default:
		return 1;
	}
	return 0;
}